

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

int __thiscall
ON_Matrix::RowReduce
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int pt_stride,double *pt,double *pivot)

{
  int iVar1;
  void *__dest;
  double **ppdVar2;
  double dVar3;
  int local_94;
  int n;
  double **this_m;
  int local_70;
  int pti;
  int rank;
  int ix;
  int k;
  int i;
  double piv;
  double x;
  double *ptB;
  double *ptA;
  double *tmp_pt;
  int sizeof_pt;
  double *pivot_local;
  double *pt_local;
  int pt_stride_local;
  int pt_dim_local;
  double zero_tolerance_local;
  ON_Matrix *this_local;
  
  iVar1 = pt_dim << 3;
  __dest = onmalloc((long)pt_dim << 3);
  ppdVar2 = ThisM(this);
  _k = 0.0;
  local_70 = 0;
  if (this->m_col_count < this->m_row_count) {
    local_94 = this->m_col_count;
  }
  else {
    local_94 = this->m_row_count;
  }
  for (rank = 0; rank < local_94; rank = rank + 1) {
    onmalloc(0);
    pti = rank;
    piv = ABS(ppdVar2[rank][rank]);
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      if (piv < ABS(ppdVar2[ix][rank])) {
        pti = ix;
        piv = ABS(ppdVar2[ix][rank]);
      }
    }
    if ((piv < _k) || (rank == 0)) {
      _k = piv;
    }
    if (piv <= zero_tolerance) break;
    local_70 = local_70 + 1;
    if (pti != rank) {
      SwapRows(this,pti,rank);
      memcpy(__dest,pt + pti * pt_stride,(long)iVar1);
      memcpy(pt + pti * pt_stride,pt + rank * pt_stride,(long)iVar1);
      memcpy(pt + rank * pt_stride,__dest,(long)iVar1);
    }
    dVar3 = 1.0 / ppdVar2[rank][rank];
    if ((dVar3 != 1.0) || (NAN(dVar3))) {
      ppdVar2[rank][rank] = 1.0;
      ON_ArrayScale((this->m_col_count + -1) - rank,dVar3,ppdVar2[rank] + (rank + 1),
                    ppdVar2[rank] + (rank + 1));
      for (this_m._4_4_ = 0; this_m._4_4_ < pt_dim; this_m._4_4_ = this_m._4_4_ + 1) {
        pt[(long)(rank * pt_stride) + (long)this_m._4_4_] =
             dVar3 * pt[(long)(rank * pt_stride) + (long)this_m._4_4_];
      }
    }
    ix = rank;
    while (ix = ix + 1, ix < this->m_row_count) {
      dVar3 = -ppdVar2[ix][rank];
      ppdVar2[ix][rank] = 0.0;
      if (zero_tolerance < ABS(dVar3)) {
        ON_Array_aA_plus_B((this->m_col_count + -1) - rank,dVar3,ppdVar2[rank] + (rank + 1),
                           ppdVar2[ix] + (rank + 1),ppdVar2[ix] + (rank + 1));
        for (this_m._4_4_ = 0; this_m._4_4_ < pt_dim; this_m._4_4_ = this_m._4_4_ + 1) {
          pt[(long)(ix * pt_stride) + (long)this_m._4_4_] =
               dVar3 * pt[(long)(rank * pt_stride) + (long)this_m._4_4_] +
               pt[(long)(ix * pt_stride) + (long)this_m._4_4_];
        }
      }
    }
  }
  if (pivot != (double *)0x0) {
    *pivot = _k;
  }
  onfree(__dest);
  return local_70;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    int pt_dim, int pt_stride, double* pt,
    double* pivot 
    )
{
  const int sizeof_pt = pt_dim*sizeof(pt[0]);
  double* tmp_pt = (double*)onmalloc(pt_dim*sizeof(tmp_pt[0]));
  double *ptA, *ptB;
  double x, piv;
  int i, k, ix, rank, pti;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
//    onfree( onmalloc( 1)); //  8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    // swap rows of matrix and B
    if ( ix != k ) {
      SwapRows( ix, k );
      ptA = pt + (ix*pt_stride);
      ptB = pt + (k*pt_stride);
      memcpy( tmp_pt, ptA, sizeof_pt );
      memcpy( ptA, ptB, sizeof_pt );
      memcpy( ptB, tmp_pt, sizeof_pt );
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    if ( x != 1.0 ) {
      this_m[k][k] = 1.0;
      ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
      ptA = pt + (k*pt_stride);
      for ( pti = 0; pti < pt_dim; pti++ )
        ptA[pti] *= x;
    }

    // zero column k for rows below this_m[k][k]
    ptB = pt + (k*pt_stride);
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        ptA = pt + (i*pt_stride);
        for ( pti = 0; pti < pt_dim; pti++ ) {
          ptA[pti] += x*ptB[pti];
        }
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  onfree(tmp_pt);

  return rank;
}